

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acceptor.cpp
# Opt level: O3

bool __thiscall FIX::Acceptor::isLoggedOn(Acceptor *this)

{
  _Rb_tree_header *p_Var1;
  byte bVar2;
  Sessions sessions;
  _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Session_*>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Session_*>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
  local_40;
  
  std::
  _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Session_*>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Session_*>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
  ::_Rb_tree(&local_40,&(this->m_sessions)._M_t);
  p_Var1 = &local_40._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)local_40._M_impl.super__Rb_tree_header._M_header._M_left == p_Var1) {
    bVar2 = 0;
  }
  else {
    do {
      bVar2 = *(byte *)((long)&local_40._M_impl.super__Rb_tree_header._M_header._M_left[0xc].
                               _M_parent[0x13]._M_color + 3) &
              *(byte *)((long)&local_40._M_impl.super__Rb_tree_header._M_header._M_left[0xc].
                               _M_parent[0x13]._M_color + 1);
      if (bVar2 != 0) break;
      local_40._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)
           std::_Rb_tree_increment(local_40._M_impl.super__Rb_tree_header._M_header._M_left);
    } while ((_Rb_tree_header *)local_40._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1);
  }
  std::
  _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Session_*>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Session_*>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
  ::~_Rb_tree(&local_40);
  return (bool)bVar2;
}

Assistant:

bool Acceptor::isLoggedOn()
{
  Sessions sessions = m_sessions;
  Sessions::iterator i = sessions.begin();
  for ( ; i != sessions.end(); ++i )
  {
    if( i->second->isLoggedOn() )
      return true;
  }
  return false;
}